

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmFileLockPool.cxx
# Opt level: O1

cmFileLockResult __thiscall cmFileLockPool::Release(cmFileLockPool *this,string *filename)

{
  bool bVar1;
  cmFileLockResult cVar2;
  pointer ppSVar3;
  bool bVar4;
  cmFileLockResult local_30;
  
  ppSVar3 = (this->FunctionScopes).
            super__Vector_base<cmFileLockPool::ScopePool_*,_std::allocator<cmFileLockPool::ScopePool_*>_>
            ._M_impl.super__Vector_impl_data._M_start;
  bVar4 = ppSVar3 ==
          (this->FunctionScopes).
          super__Vector_base<cmFileLockPool::ScopePool_*,_std::allocator<cmFileLockPool::ScopePool_*>_>
          ._M_impl.super__Vector_impl_data._M_finish;
  if (!bVar4) {
    local_30 = ScopePool::Release(*ppSVar3,filename);
    bVar1 = cmFileLockResult::IsOk(&local_30);
    if (bVar1) {
      do {
        ppSVar3 = ppSVar3 + 1;
        bVar4 = ppSVar3 ==
                (this->FunctionScopes).
                super__Vector_base<cmFileLockPool::ScopePool_*,_std::allocator<cmFileLockPool::ScopePool_*>_>
                ._M_impl.super__Vector_impl_data._M_finish;
        if (bVar4) goto LAB_003b1997;
        local_30 = ScopePool::Release(*ppSVar3,filename);
        bVar1 = cmFileLockResult::IsOk(&local_30);
      } while (bVar1);
    }
    if (!bVar4) {
      return local_30;
    }
  }
LAB_003b1997:
  ppSVar3 = (this->FileScopes).
            super__Vector_base<cmFileLockPool::ScopePool_*,_std::allocator<cmFileLockPool::ScopePool_*>_>
            ._M_impl.super__Vector_impl_data._M_start;
  bVar4 = ppSVar3 ==
          (this->FileScopes).
          super__Vector_base<cmFileLockPool::ScopePool_*,_std::allocator<cmFileLockPool::ScopePool_*>_>
          ._M_impl.super__Vector_impl_data._M_finish;
  if (!bVar4) {
    local_30 = ScopePool::Release(*ppSVar3,filename);
    bVar1 = cmFileLockResult::IsOk(&local_30);
    if (bVar1) {
      do {
        ppSVar3 = ppSVar3 + 1;
        bVar4 = ppSVar3 ==
                (this->FileScopes).
                super__Vector_base<cmFileLockPool::ScopePool_*,_std::allocator<cmFileLockPool::ScopePool_*>_>
                ._M_impl.super__Vector_impl_data._M_finish;
        if (bVar4) goto LAB_003b19fb;
        local_30 = ScopePool::Release(*ppSVar3,filename);
        bVar1 = cmFileLockResult::IsOk(&local_30);
      } while (bVar1);
    }
    if (!bVar4) {
      return local_30;
    }
  }
LAB_003b19fb:
  cVar2 = ScopePool::Release(&this->ProcessScope,filename);
  return cVar2;
}

Assistant:

cmFileLockResult cmFileLockPool::Release(const std::string& filename)
{
  for (It i = this->FunctionScopes.begin(); i != this->FunctionScopes.end();
       ++i) {
    const cmFileLockResult result = (*i)->Release(filename);
    if (!result.IsOk()) {
      return result;
    }
  }

  for (It i = this->FileScopes.begin(); i != this->FileScopes.end(); ++i) {
    const cmFileLockResult result = (*i)->Release(filename);
    if (!result.IsOk()) {
      return result;
    }
  }

  return this->ProcessScope.Release(filename);
}